

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSweep.c
# Opt level: O0

void Dch_ManSweep(Dch_Man_t *p)

{
  FILE *pFile;
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Bar_Progress_t *p_00;
  Aig_Obj_t *p1;
  int local_2c;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Dch_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAigTotal);
  pAVar2 = Aig_ManStart(iVar1);
  p->pAigFraig = pAVar2;
  Aig_ManCleanData(p->pAigTotal);
  pAVar3 = Aig_ManConst1(p->pAigFraig);
  pAVar4 = Aig_ManConst1(p->pAigTotal);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->pAigTotal->vCis), pFile = _stdout, local_2c < iVar1;
      local_2c = local_2c + 1) {
    pvVar5 = Vec_PtrEntry(p->pAigTotal->vCis,local_2c);
    pAVar3 = Aig_ObjCreateCi(p->pAigFraig);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  iVar1 = Aig_ManObjNumMax(p->pAigTotal);
  p_00 = Bar_ProgressStart(pFile,iVar1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->pAigTotal->vObjs), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAigTotal->vObjs,local_2c);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      Bar_ProgressUpdate(p_00,local_2c,(char *)0x0);
      pAVar4 = Aig_ObjFanin0(pAVar3);
      pAVar4 = Dch_ObjFraig(pAVar4);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        pAVar4 = Aig_ObjFanin1(pAVar3);
        pAVar4 = Dch_ObjFraig(pAVar4);
        if (pAVar4 != (Aig_Obj_t *)0x0) {
          pAVar2 = p->pAigFraig;
          pAVar4 = Dch_ObjChild0Fra(pAVar3);
          p1 = Dch_ObjChild1Fra(pAVar3);
          pAVar4 = Aig_And(pAVar2,pAVar4,p1);
          if (pAVar4 != (Aig_Obj_t *)0x0) {
            Dch_ObjSetFraig(pAVar3,pAVar4);
            Dch_ManSweepNode(p,pAVar3);
          }
        }
      }
    }
  }
  Bar_ProgressStop(p_00);
  if (p->pAigTotal->pReprs != (Aig_Obj_t **)0x0) {
    free(p->pAigTotal->pReprs);
    p->pAigTotal->pReprs = (Aig_Obj_t **)0x0;
  }
  p->pAigTotal->pReprs = p->pReprsProved;
  p->pReprsProved = (Aig_Obj_t **)0x0;
  Aig_ManCleanMarkB(p->pAigTotal);
  return;
}

Assistant:

void Dch_ManSweep( Dch_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    // map constants and PIs
    p->pAigFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAigTotal) );
    Aig_ManCleanData( p->pAigTotal );
    Aig_ManConst1(p->pAigTotal)->pData = Aig_ManConst1(p->pAigFraig);
    Aig_ManForEachCi( p->pAigTotal, pObj, i )
        pObj->pData = Aig_ObjCreateCi( p->pAigFraig );
    // sweep internal nodes
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAigTotal) );
    Aig_ManForEachNode( p->pAigTotal, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Dch_ObjFraig(Aig_ObjFanin0(pObj)) == NULL || 
             Dch_ObjFraig(Aig_ObjFanin1(pObj)) == NULL )
            continue;
        pObjNew = Aig_And( p->pAigFraig, Dch_ObjChild0Fra(pObj), Dch_ObjChild1Fra(pObj) );
        if ( pObjNew == NULL )
            continue;
        Dch_ObjSetFraig( pObj, pObjNew );
        Dch_ManSweepNode( p, pObj );
    }
    Bar_ProgressStop( pProgress );
    // update the representatives of the nodes (makes classes invalid)
    ABC_FREE( p->pAigTotal->pReprs );
    p->pAigTotal->pReprs = p->pReprsProved;
    p->pReprsProved = NULL;
    // clean the mark
    Aig_ManCleanMarkB( p->pAigTotal );
}